

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trajectory.hpp
# Opt level: O0

void __thiscall
ruckig::Trajectory<0UL,_ruckig::StandardVector>::at_time
          (Trajectory<0UL,_ruckig::StandardVector> *this,double time,Vector<double> *new_position,
          Vector<double> *new_velocity,Vector<double> *new_acceleration,Vector<double> *new_jerk,
          size_t *new_section)

{
  size_type sVar1;
  size_type sVar2;
  RuckigError *this_00;
  anon_class_32_4_098e0619 local_98;
  undefined1 local_75;
  allocator<char> local_61;
  string local_60;
  size_t *local_40;
  size_t *new_section_local;
  Vector<double> *new_jerk_local;
  Vector<double> *new_acceleration_local;
  Vector<double> *new_velocity_local;
  Vector<double> *new_position_local;
  double time_local;
  Trajectory<0UL,_ruckig::StandardVector> *this_local;
  
  sVar1 = this->degrees_of_freedom;
  local_40 = new_section;
  new_section_local = (size_t *)new_jerk;
  new_jerk_local = new_acceleration;
  new_acceleration_local = new_velocity;
  new_velocity_local = new_position;
  new_position_local = (Vector<double> *)time;
  time_local = (double)this;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(new_position);
  if (sVar1 == sVar2) {
    sVar1 = this->degrees_of_freedom;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(new_acceleration_local);
    if (sVar1 == sVar2) {
      sVar1 = this->degrees_of_freedom;
      sVar2 = std::vector<double,_std::allocator<double>_>::size(new_jerk_local);
      if (sVar1 == sVar2) {
        sVar1 = this->degrees_of_freedom;
        sVar2 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)new_section_local);
        if (sVar1 == sVar2) {
          local_98.new_position = new_velocity_local;
          local_98.new_velocity = new_acceleration_local;
          local_98.new_acceleration = new_jerk_local;
          local_98.new_jerk = (Vector<double> *)new_section_local;
          Trajectory<0ul,ruckig::StandardVector>::
          state_to_integrate_from<ruckig::Trajectory<0ul,ruckig::StandardVector>::at_time(double,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&,unsigned_long&)const::_lambda(unsigned_long,double,double,double,double,double)_1_>
                    ((Trajectory<0ul,ruckig::StandardVector> *)this,(double)new_position_local,
                     local_40,&local_98);
          return;
        }
      }
    }
  }
  local_75 = 1;
  this_00 = (RuckigError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"mismatch in degrees of freedom (vector size).",&local_61);
  RuckigError::RuckigError(this_00,&local_60);
  local_75 = 0;
  __cxa_throw(this_00,&RuckigError::typeinfo,RuckigError::~RuckigError);
}

Assistant:

void at_time(double time, Vector<double>& new_position, Vector<double>& new_velocity, Vector<double>& new_acceleration, Vector<double>& new_jerk, size_t& new_section) const {
        if constexpr (DOFs == 0) {
            if (degrees_of_freedom != new_position.size() || degrees_of_freedom != new_velocity.size() || degrees_of_freedom != new_acceleration.size() || degrees_of_freedom != new_jerk.size()) {
                throw RuckigError("mismatch in degrees of freedom (vector size).");
            }
        }

        state_to_integrate_from(time, new_section, [&](size_t dof, double t, double p, double v, double a, double j) {
            std::tie(new_position[dof], new_velocity[dof], new_acceleration[dof]) = integrate(t, p, v, a, j);
            new_jerk[dof] = j;
        });
    }